

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
::push_back(SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
            *this,InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>
                  *Elt)

{
  void **ppvVar1;
  MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
  *this_00;
  
  this_00 = (MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
             *)(this->
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
               ).super_SmallVectorBase.EndX;
  if ((MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
       *)(this->
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
         ).super_SmallVectorBase.CapacityX <= this_00) {
    grow(this,0);
    this_00 = (MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
               *)(this->
                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
                 ).super_SmallVectorBase.EndX;
  }
  Fixpp::
  MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
  ::MessageBase(this_00,&Elt->
                         super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>
               );
  ppvVar1 = &(this->
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
             ).super_SmallVectorBase.EndX;
  *ppvVar1 = (void *)((long)*ppvVar1 + 0x138);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->EndX >= this->CapacityX))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->setEnd(this->end()+1);
  }